

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O2

void __thiscall
PRED<UF>::PerformLabelingMem
          (PRED<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  undefined4 uVar6;
  Mat1b *pMVar7;
  pointer puVar8;
  pointer piVar9;
  int r_i;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  void *__child_stack;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  void *in_R8;
  long lVar22;
  int iVar23;
  int c_i;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double dVar29;
  allocator_type local_2d1;
  long local_2d0;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  value_type_conflict3 local_100;
  Size local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_f8.height = (int)uVar2;
  local_f8.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_f8,0);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UF::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  UF::MemSetup();
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar17 = *(int *)&pMVar7->field_0xc;
  iVar5 = *(int *)&pMVar7->field_0x8;
  iVar23 = -1;
  while (iVar10 = iVar23, iVar10 + 1 < iVar17) {
    lVar26 = (long)iVar10;
    piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    iVar23 = iVar10 + 1;
    if (*(char *)(img.img_._16_8_ + 1 + lVar26) != '\0') {
      uVar11 = UF::MemNewLabel();
      lVar12 = img_labels.accesses_._16_8_ + lVar26 * 4;
      *(int *)(lVar12 + 4) = *(int *)(lVar12 + 4) + 1;
      lVar27 = img_labels.img_._16_8_ + lVar26 * 4;
      *(uint *)(lVar27 + 4) = uVar11;
      lVar20 = 0;
      while( true ) {
        in_R8 = (void *)(lVar26 + 2 + lVar20);
        if ((long)iVar17 <= (long)in_R8) goto LAB_0018f346;
        piVar1 = (int *)(img.accesses_._16_8_ + lVar26 * 4 + 8 + lVar20 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(img.img_._16_8_ + lVar26 + 2 + lVar20) == '\0') break;
        piVar1 = (int *)(lVar12 + 4 + lVar20 * 4);
        *piVar1 = *piVar1 + 1;
        uVar6 = *(undefined4 *)(lVar27 + 4 + lVar20 * 4);
        piVar1 = (int *)(lVar12 + 8 + lVar20 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar27 + 8 + lVar20 * 4) = uVar6;
        lVar20 = lVar20 + 1;
      }
      iVar23 = iVar10 + (int)lVar20 + 2;
    }
  }
LAB_0018f346:
  iVar17 = iVar17 + -1;
  lVar12 = (long)iVar17;
  lVar26 = 1;
  lVar27 = 0;
  while( true ) {
    if (iVar5 <= lVar26) {
      uVar11 = UF::MemFlatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
      for (lVar26 = 0;
          piVar9 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          puVar8 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start, lVar26 < img_labels.rows;
          lVar26 = lVar26 + 1) {
        for (lVar12 = 0; lVar12 < img_labels.cols; lVar12 = lVar12 + 1) {
          lVar27 = *(long *)img_labels.accesses_._72_8_ * lVar26 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar27 + lVar12 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_;
          iVar17 = *(int *)(lVar20 + lVar12 * 4);
          piVar9[iVar17] = piVar9[iVar17] + 1;
          uVar11 = puVar8[iVar17];
          piVar1 = (int *)(lVar27 + lVar12 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar20 + lVar12 * 4) = uVar11;
        }
        in_R8 = (void *)img_labels.img_._72_8_;
      }
      local_100 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,4,&local_100,
                 &local_2d1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(accesses,&local_f0)
      ;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0);
      dVar29 = MemMat<unsigned_char>::GetTotalAccesses(&img);
      *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start =
           (long)(dVar29 - 9.223372036854776e+18) & (long)dVar29 >> 0x3f | (long)dVar29;
      dVar29 = MemMat<int>::GetTotalAccesses(&img_labels);
      (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[1] =
           (long)(dVar29 - 9.223372036854776e+18) & (long)dVar29 >> 0x3f | (long)dVar29;
      dVar29 = UF::MemTotalAccesses();
      uVar18 = (ulong)dVar29;
      __child_stack =
           (void *)((long)(dVar29 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18);
      (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
      cv::Mat_<int>::clone
                (&local_f0,(__fn *)&img_labels.img_,__child_stack,(int)((long)uVar18 >> 0x3f),in_R8)
      ;
      cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,&local_f0.super_Mat);
      cv::Mat::~Mat(&local_f0.super_Mat);
      MemMat<int>::~MemMat(&img_labels);
      MemMat<unsigned_char>::~MemMat(&img);
      return;
    }
    lVar20 = *(long *)img.accesses_._72_8_;
    piVar1 = (int *)(img.accesses_._16_8_ + lVar20 * lVar26);
    *piVar1 = *piVar1 + 1;
    lVar13 = *(long *)img.img_._72_8_;
    cVar3 = *(char *)(img.img_._16_8_ + lVar13 * lVar26);
    if (iVar17 != 0) break;
    if (cVar3 != '\0') {
      lVar14 = lVar26 + -1;
      piVar1 = (int *)(img.accesses_._16_8_ + lVar20 * lVar14);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(img.img_._16_8_ + lVar13 * lVar14) == '\0') {
        uVar11 = UF::MemNewLabel();
        piVar1 = (int *)(img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar26
                        );
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * lVar26) = uVar11;
      }
      else {
        lVar20 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * lVar14);
        *piVar1 = *piVar1 + 1;
        lVar13 = *(long *)img_labels.img_._72_8_;
        uVar6 = *(undefined4 *)(img_labels.img_._16_8_ + lVar14 * lVar13);
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * lVar26);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(img_labels.img_._16_8_ + lVar13 * lVar26) = uVar6;
      }
    }
LAB_00190154:
    lVar26 = lVar26 + 1;
    lVar27 = lVar27 + 1;
  }
  if (cVar3 == '\0') {
    uVar18 = 0;
    goto LAB_0018f56c;
  }
  lVar14 = lVar26 + -1;
  piVar1 = (int *)(img.accesses_._16_8_ + lVar20 * lVar14);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(img.img_._16_8_ + lVar13 * lVar14) == '\0') {
    piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar20 * lVar14);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(img.img_._16_8_ + 1 + lVar13 * lVar14) != '\0') {
      lVar20 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(img_labels.accesses_._16_8_ + 4 + lVar20 * lVar14);
      *piVar1 = *piVar1 + 1;
      lVar13 = *(long *)img_labels.img_._72_8_;
      uVar6 = *(undefined4 *)(img_labels.img_._16_8_ + 4 + lVar14 * lVar13);
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * lVar26);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + lVar13 * lVar26) = uVar6;
      iVar23 = 0;
      goto LAB_0018fc82;
    }
    uVar11 = UF::MemNewLabel();
    piVar1 = (int *)(img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar26);
    *piVar1 = *piVar1 + 1;
    *(uint *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * lVar26) = uVar11;
    lVar20 = 0;
    goto LAB_0018f9f8;
  }
  lVar20 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * lVar14);
  *piVar1 = *piVar1 + 1;
  lVar13 = *(long *)img_labels.img_._72_8_;
  uVar6 = *(undefined4 *)(img_labels.img_._16_8_ + lVar13 * lVar14);
  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * lVar26);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(img_labels.img_._16_8_ + lVar13 * lVar26) = uVar6;
  uVar18 = 0;
LAB_0018fd2b:
  lVar13 = lVar26 + -1;
  local_2d0 = img_labels.accesses_._72_8_;
  iVar23 = (int)uVar18;
  lVar22 = (long)iVar23;
  lVar14 = lVar22 << 0x20;
  lVar24 = img.accesses_._16_8_ + lVar22 * 4 + 4;
  lVar20 = lVar22 + 1 + img.img_._16_8_;
  lVar16 = img_labels.img_._16_8_ + lVar22 * 4 + 4;
  lVar21 = img_labels.accesses_._16_8_ + lVar22 * 4 + 4;
  lVar25 = 0;
  while( true ) {
    lVar15 = lVar14 >> 0x1e;
    if (lVar12 <= lVar22 + 1 + lVar25) {
      lVar20 = *(long *)img.accesses_._72_8_;
      lVar16 = lVar14 + 0x100000000 >> 0x20;
      piVar1 = (int *)((lVar14 + 0x100000000 >> 0x1e) + lVar20 * lVar26 + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar14 = *(long *)img.img_._72_8_;
      in_R8 = (void *)img.img_._16_8_;
      if (*(char *)(lVar16 + lVar14 * lVar26 + img.img_._16_8_) != '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + lVar20 * lVar13 + lVar16 * 4);
        *piVar1 = *piVar1 + 1;
        in_R8 = (void *)(img.img_._16_8_ + lVar14 * lVar13);
        lVar20 = *(long *)img_labels.accesses_._72_8_;
        if (*(char *)(lVar16 + (long)in_R8) == '\0') {
          lVar13 = img_labels.accesses_._16_8_ + lVar20 * lVar26;
          piVar1 = (int *)(lVar15 + lVar13);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_;
          uVar6 = *(undefined4 *)(lVar15 + lVar20);
          piVar1 = (int *)(lVar13 + lVar16 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar20 + lVar16 * 4) = uVar6;
        }
        else {
          piVar1 = (int *)(lVar20 * lVar13 + img_labels.accesses_._16_8_ + lVar16 * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = *(long *)img_labels.img_._72_8_;
          uVar6 = *(undefined4 *)(lVar13 * lVar14 + img_labels.img_._16_8_ + lVar16 * 4);
          piVar1 = (int *)(lVar20 * lVar26 + img_labels.accesses_._16_8_ + lVar16 * 4);
          *piVar1 = *piVar1 + 1;
          in_R8 = (void *)(lVar14 * lVar26 + img_labels.img_._16_8_);
          *(undefined4 *)((long)in_R8 + lVar16 * 4) = uVar6;
        }
      }
      goto LAB_00190154;
    }
    lVar28 = *(long *)img.accesses_._72_8_;
    piVar1 = (int *)(lVar26 * lVar28 + lVar24 + lVar25 * 4);
    *piVar1 = *piVar1 + 1;
    lVar19 = *(long *)img.img_._72_8_;
    if (*(char *)(lVar25 + lVar26 * lVar19 + lVar20) == '\0') {
      uVar18 = (ulong)(iVar23 + (int)lVar25 + 1);
      goto LAB_0018f56c;
    }
    lVar28 = lVar28 * lVar13;
    piVar1 = (int *)(lVar24 + lVar28 + lVar25 * 4);
    *piVar1 = *piVar1 + 1;
    lVar19 = lVar19 * lVar13;
    if (*(char *)(lVar25 + lVar20 + lVar19) == '\0') break;
    lVar15 = *(long *)img_labels.accesses_._72_8_;
    piVar1 = (int *)(lVar15 * lVar13 + lVar21 + lVar25 * 4);
    *piVar1 = *piVar1 + 1;
    lVar28 = *(long *)img_labels.img_._72_8_;
    uVar6 = *(undefined4 *)(lVar28 * lVar13 + lVar16 + lVar25 * 4);
    piVar1 = (int *)(lVar15 * lVar26 + lVar21 + lVar25 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar28 * lVar26 + lVar16 + lVar25 * 4) = uVar6;
    lVar14 = lVar14 + 0x100000000;
    lVar25 = lVar25 + 1;
  }
  piVar1 = (int *)(img.accesses_._16_8_ + lVar28 + (lVar14 + 0x200000000 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  lVar20 = lVar14 + 0x200000000 >> 0x20;
  if (*(char *)(img.img_._16_8_ + lVar19 + lVar20) == '\0') {
    lVar20 = *(long *)img_labels.accesses_._72_8_ * lVar26 + img_labels.accesses_._16_8_;
    piVar1 = (int *)(lVar15 + lVar20);
    *piVar1 = *piVar1 + 1;
    lVar13 = *(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_;
    uVar6 = *(undefined4 *)(lVar15 + lVar13);
    piVar1 = (int *)(lVar20 + lVar22 * 4 + 4 + lVar25 * 4);
    *piVar1 = *piVar1 + 1;
    lVar20 = lVar22 + lVar25 + 1;
    *(undefined4 *)(lVar13 + lVar22 * 4 + 4 + lVar25 * 4) = uVar6;
    goto LAB_0018f9f8;
  }
  lVar14 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(lVar15 + lVar14 * lVar26 + img_labels.accesses_._16_8_);
  *piVar1 = *piVar1 + 1;
  lVar16 = *(long *)img_labels.img_._72_8_;
  uVar11 = *(uint *)(lVar15 + lVar16 * lVar26 + img_labels.img_._16_8_);
  in_R8 = (void *)(lVar14 * lVar13 + img_labels.accesses_._16_8_);
  piVar1 = (int *)((long)in_R8 + lVar20 * 4);
  *piVar1 = *piVar1 + 1;
  uVar18 = (ulong)(iVar23 + (int)lVar25 + 1);
  uVar11 = UF::MemMerge(uVar11,*(uint *)(lVar16 * lVar13 + img_labels.img_._16_8_ + lVar20 * 4));
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar26 + img_labels.accesses_._16_8_ +
                   lVar22 * 4 + 4 + lVar25 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(*(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_ + lVar22 * 4 + 4 +
           lVar25 * 4) = uVar11;
LAB_0018fc78:
  do {
    iVar23 = (int)uVar18;
LAB_0018fc82:
    lVar20 = (long)iVar23;
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + 4 + lVar20 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    uVar18 = lVar20 + 1;
    cVar3 = *(char *)(lVar20 + 1 + *(long *)img.img_._72_8_ * lVar26 + img.img_._16_8_);
    if (iVar17 <= (int)uVar18) {
      if (cVar3 != '\0') {
        lVar13 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar13 * (lVar26 + -1) + img_labels.accesses_._16_8_ + 4 + lVar20 * 4);
        *piVar1 = *piVar1 + 1;
        lVar14 = *(long *)img_labels.img_._72_8_;
        uVar6 = *(undefined4 *)((lVar26 + -1) * lVar14 + img_labels.img_._16_8_ + 4 + lVar20 * 4);
        piVar1 = (int *)(lVar13 * lVar26 + img_labels.accesses_._16_8_ + 4 + lVar20 * 4);
        *piVar1 = *piVar1 + 1;
        in_R8 = (void *)(lVar14 * lVar26 + img_labels.img_._16_8_);
        *(undefined4 *)((long)in_R8 + lVar20 * 4 + 4) = uVar6;
      }
      goto LAB_00190154;
    }
    if (cVar3 != '\0') {
      lVar13 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar13 * (lVar26 + -1) + img_labels.accesses_._16_8_ + 4 + lVar20 * 4);
      *piVar1 = *piVar1 + 1;
      lVar14 = *(long *)img_labels.img_._72_8_;
      uVar6 = *(undefined4 *)(lVar14 * (lVar26 + -1) + img_labels.img_._16_8_ + 4 + lVar20 * 4);
      piVar1 = (int *)(lVar13 * lVar26 + img_labels.accesses_._16_8_ + 4 + lVar20 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar14 * lVar26 + img_labels.img_._16_8_ + 4 + lVar20 * 4) = uVar6;
      goto LAB_0018fd2b;
    }
LAB_0018f56c:
    while( true ) {
      lVar16 = (long)(int)uVar18;
      lVar20 = img.accesses_._16_8_ + lVar16 * 4;
      lVar13 = lVar16 << 0x20;
      lVar14 = 0;
      do {
        lVar21 = lVar13;
        lVar22 = lVar21 >> 0x20;
        if (lVar12 <= lVar16 + lVar14 + 1) {
          lVar20 = *(long *)img.accesses_._72_8_;
          lVar13 = lVar21 + 0x100000000 >> 0x20;
          piVar1 = (int *)((lVar21 + 0x100000000 >> 0x1e) + lVar20 * lVar26 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          in_R8 = *(void **)img.img_._72_8_;
          if (*(char *)(lVar13 + (long)in_R8 * lVar26 + img.img_._16_8_) != '\0') {
            lVar14 = lVar26 + -1;
            lVar20 = img.accesses_._16_8_ + lVar20 * lVar14;
            piVar1 = (int *)(lVar20 + lVar13 * 4);
            *piVar1 = *piVar1 + 1;
            in_R8 = (void *)((long)in_R8 * lVar14);
            if (*(char *)((long)in_R8 + lVar13 + img.img_._16_8_) == '\0') {
              piVar1 = (int *)(lVar20 + (lVar21 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)in_R8 + lVar22 + img.img_._16_8_) == '\0') {
                uVar11 = UF::MemNewLabel();
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar26 +
                                 img_labels.accesses_._16_8_ + lVar13 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_ +
                         lVar13 * 4) = uVar11;
              }
              else {
                lVar20 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar20 * lVar14 + img_labels.accesses_._16_8_ + lVar22 * 4);
                *piVar1 = *piVar1 + 1;
                lVar16 = *(long *)img_labels.img_._72_8_;
                uVar6 = *(undefined4 *)(lVar14 * lVar16 + img_labels.img_._16_8_ + lVar22 * 4);
                piVar1 = (int *)(lVar20 * lVar26 + img_labels.accesses_._16_8_ + lVar13 * 4);
                *piVar1 = *piVar1 + 1;
                in_R8 = (void *)(lVar16 * lVar26 + img_labels.img_._16_8_);
                *(undefined4 *)((long)in_R8 + lVar13 * 4) = uVar6;
              }
            }
            else {
              lVar20 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar20 * lVar14 + img_labels.accesses_._16_8_ + lVar13 * 4);
              *piVar1 = *piVar1 + 1;
              lVar16 = *(long *)img_labels.img_._72_8_;
              uVar6 = *(undefined4 *)(lVar14 * lVar16 + img_labels.img_._16_8_ + lVar13 * 4);
              piVar1 = (int *)(lVar20 * lVar26 + img_labels.accesses_._16_8_ + lVar13 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar16 * lVar26 + img_labels.img_._16_8_ + lVar13 * 4) = uVar6;
            }
          }
          goto LAB_00190154;
        }
        lVar15 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar26 * lVar15 + lVar20 + 4 + lVar14 * 4);
        *piVar1 = *piVar1 + 1;
        lVar28 = *(long *)img.img_._72_8_;
        lVar24 = lVar14 + 1;
        lVar25 = lVar14 + 1;
        lVar13 = lVar21 + 0x100000000;
        lVar14 = lVar24;
      } while (*(char *)(lVar25 + lVar26 * lVar28 + img.img_._16_8_ + lVar16) == '\0');
      uVar18 = (uVar18 & 0xffffffff) + lVar24;
      lVar13 = lVar26 + -1;
      piVar1 = (int *)(lVar20 + lVar27 * lVar15 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar24 + img.img_._16_8_ + lVar16 + lVar27 * lVar28) != '\0') {
        lVar20 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar20 * lVar27 + img_labels.accesses_._16_8_ + lVar16 * 4 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar13 = *(long *)img_labels.img_._72_8_;
        uVar6 = *(undefined4 *)(lVar13 * lVar27 + img_labels.img_._16_8_ + lVar16 * 4 + lVar24 * 4);
        piVar1 = (int *)(lVar20 * lVar26 + img_labels.accesses_._16_8_ + lVar16 * 4 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar13 * lVar26 + img_labels.img_._16_8_ + lVar16 * 4 + lVar24 * 4) = uVar6;
        goto LAB_0018fd2b;
      }
      lVar14 = img.accesses_._16_8_ + lVar15 * lVar13;
      lVar20 = img.img_._16_8_ + lVar28 * lVar13;
      piVar1 = (int *)(lVar14 + (lVar21 + 0x200000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      in_R8 = (void *)(lVar21 + 0x200000000 >> 0x20);
      cVar3 = *(char *)(lVar20 + (long)in_R8);
      piVar1 = (int *)(lVar14 + (lVar21 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      cVar4 = *(char *)(lVar20 + lVar22);
      if (cVar3 != '\0') break;
      lVar20 = lVar16 + lVar24;
      if (cVar4 == '\0') {
        uVar11 = UF::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar26 + img_labels.accesses_._16_8_
                         + lVar16 * 4 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar13 = *(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_ + lVar16 * 4;
      }
      else {
        lVar14 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * lVar13 + img_labels.accesses_._16_8_ + lVar22 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img_labels.img_._72_8_;
        uVar11 = *(uint *)(lVar13 * lVar21 + img_labels.img_._16_8_ + lVar22 * 4);
        piVar1 = (int *)(lVar14 * lVar26 + img_labels.accesses_._16_8_ + lVar16 * 4 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar13 = lVar21 * lVar26 + img_labels.img_._16_8_ + lVar16 * 4;
      }
      *(uint *)(lVar13 + lVar24 * 4) = uVar11;
LAB_0018f9f8:
      iVar23 = (int)lVar20;
      lVar16 = (long)iVar23;
      lVar13 = lVar20 << 0x20;
      in_R8 = (void *)(lVar16 * 4 + img.accesses_._16_8_);
      lVar14 = 0;
      while( true ) {
        lVar21 = lVar13 >> 0x1e;
        local_2d0 = lVar20;
        if (lVar12 <= lVar16 + lVar14 + 1) {
          piVar1 = (int *)((lVar13 + 0x100000000 >> 0x1e) +
                          *(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          lVar20 = lVar13 + 0x100000000 >> 0x20;
          if (*(char *)(lVar20 + *(long *)img.img_._72_8_ * lVar26 + img.img_._16_8_) != '\0') {
            lVar13 = *(long *)img_labels.accesses_._72_8_ * lVar26 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar21 + lVar13);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_;
            uVar6 = *(undefined4 *)(lVar21 + lVar14);
            piVar1 = (int *)(lVar13 + lVar20 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar14 + lVar20 * 4) = uVar6;
          }
          goto LAB_00190154;
        }
        lVar22 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)((long)in_R8 + lVar14 * 4 + lVar26 * lVar22 + 4);
        *piVar1 = *piVar1 + 1;
        lVar24 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar14 + 1 + lVar26 * lVar24 + img.img_._16_8_ + lVar16) == '\0') break;
        piVar1 = (int *)((long)in_R8 + lVar14 * 4 + lVar22 * lVar27 + 8);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar14 + 2 + lVar24 * lVar27 + img.img_._16_8_ + lVar16) != '\0') {
          uVar18 = (ulong)(iVar23 + (int)lVar14 + 1);
          lVar20 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar21 + lVar20 * lVar26 + img_labels.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          lVar13 = *(long *)img_labels.img_._72_8_;
          uVar11 = *(uint *)(lVar21 + lVar13 * lVar26 + img_labels.img_._16_8_);
          piVar1 = (int *)(lVar20 * lVar27 + img_labels.accesses_._16_8_ + lVar16 * 4 + 8 +
                          lVar14 * 4);
          *piVar1 = *piVar1 + 1;
          in_R8 = (void *)(lVar13 * lVar27 + img_labels.img_._16_8_);
          uVar11 = UF::MemMerge(uVar11,*(uint *)((long)in_R8 + lVar14 * 4 + lVar16 * 4 + 8));
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar26 +
                           img_labels.accesses_._16_8_ + lVar16 * 4 + 4 + lVar14 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_ + lVar16 * 4 +
                    4 + lVar14 * 4) = uVar11;
          goto LAB_0018fc78;
        }
        lVar21 = *(long *)img_labels.accesses_._72_8_ * lVar26 +
                 img_labels.accesses_._16_8_ + lVar16 * 4 + 4;
        piVar1 = (int *)(lVar21 + -4 + lVar14 * 4);
        *piVar1 = *piVar1 + 1;
        lVar22 = *(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_ + lVar16 * 4 + 4;
        uVar6 = *(undefined4 *)(lVar22 + -4 + lVar14 * 4);
        piVar1 = (int *)(lVar21 + lVar14 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar22 + lVar14 * 4) = uVar6;
        lVar13 = lVar13 + 0x100000000;
        lVar14 = lVar14 + 1;
      }
      uVar18 = (ulong)(iVar23 + (int)lVar14 + 1);
    }
    lVar20 = *(long *)img_labels.accesses_._72_8_;
    lVar14 = lVar20 * lVar13 + img_labels.accesses_._16_8_;
    if (cVar4 == '\0') {
      piVar1 = (int *)(lVar14 + (long)in_R8 * 4);
      *piVar1 = *piVar1 + 1;
      lVar14 = *(long *)img_labels.img_._72_8_;
      uVar11 = *(uint *)(lVar13 * lVar14 + img_labels.img_._16_8_ + (long)in_R8 * 4);
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * lVar26 + lVar16 * 4 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar20 = lVar14 * lVar26 + img_labels.img_._16_8_ + lVar16 * 4;
    }
    else {
      piVar1 = (int *)(lVar14 + lVar22 * 4);
      *piVar1 = *piVar1 + 1;
      lVar20 = lVar13 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
      uVar11 = *(uint *)(lVar20 + lVar22 * 4);
      piVar1 = (int *)(lVar14 + (long)in_R8 * 4);
      *piVar1 = *piVar1 + 1;
      uVar11 = UF::MemMerge(uVar11,*(uint *)(lVar20 + (long)in_R8 * 4));
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar26 + img_labels.accesses_._16_8_ +
                       lVar16 * 4 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar20 = *(long *)img_labels.img_._72_8_ * lVar26 + img_labels.img_._16_8_ + lVar16 * 4;
    }
    *(uint *)(lVar20 + lVar24 * 4) = uVar11;
  } while( true );
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0); 

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img(r,c)>0
#define CONDITION_P img(r-1,c-1)>0
#define CONDITION_Q img(r-1,c)>0
#define CONDITION_R img(r-1,c+1)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r,c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r,c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r,c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r,c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r,c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r - 1, c - 1), img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r, c - 1), img_labels(r - 1, c + 1)); // x <- s + r

#define COLS w

        {
            int r = 0; 
#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows' for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i, c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage(); 

        LabelsSolver::MemDealloc();
    }